

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry.cc
# Opt level: O2

int __thiscall Typelib::Registry::remove(Registry *this,char *__filename)

{
  size_type sVar1;
  iterator iVar2;
  iterator iVar3;
  Type *in_RDX;
  iterator __position;
  iterator __position_00;
  
  reverseDepends((set<Typelib::Type_*,_std::less<Typelib::Type_*>,_std::allocator<Typelib::Type_*>_>
                  *)this,(Registry *)__filename,in_RDX);
  iVar2._M_node = *(_Base_ptr *)(__filename + 0x18);
  while (__position._M_node = iVar2._M_node, __position._M_node != (_Base_ptr)(__filename + 8)) {
    sVar1 = std::set<Typelib::Type_*,_std::less<Typelib::Type_*>,_std::allocator<Typelib::Type_*>_>
            ::count((set<Typelib::Type_*,_std::less<Typelib::Type_*>,_std::allocator<Typelib::Type_*>_>
                     *)this,(key_type *)(__position._M_node + 2));
    iVar2._M_node = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
    if (sVar1 != 0) {
      std::
      _Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,Typelib::Registry::RegistryType>,std::_Select1st<std::pair<std::__cxx11::string_const,Typelib::Registry::RegistryType>>,bool(*)(std::__cxx11::string_const&,std::__cxx11::string_const&),std::allocator<std::pair<std::__cxx11::string_const,Typelib::Registry::RegistryType>>>
      ::erase_abi_cxx11_((_Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,Typelib::Registry::RegistryType>,std::_Select1st<std::pair<std::__cxx11::string_const,Typelib::Registry::RegistryType>>,bool(*)(std::__cxx11::string_const&,std::__cxx11::string_const&),std::allocator<std::pair<std::__cxx11::string_const,Typelib::Registry::RegistryType>>>
                          *)__filename,__position);
    }
  }
  iVar3._M_node = *(_Base_ptr *)(__filename + 0x48);
  while (__position_00._M_node = iVar3._M_node,
        __position_00._M_node != (_Base_ptr)(__filename + 0x38)) {
    sVar1 = std::set<Typelib::Type_*,_std::less<Typelib::Type_*>,_std::allocator<Typelib::Type_*>_>
            ::count((set<Typelib::Type_*,_std::less<Typelib::Type_*>,_std::allocator<Typelib::Type_*>_>
                     *)this,(key_type *)(__position_00._M_node + 2));
    iVar3._M_node = (_Base_ptr)std::_Rb_tree_increment(__position_00._M_node);
    if (sVar1 != 0) {
      std::
      _Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,Typelib::Registry::RegistryType>,std::_Select1st<std::pair<std::__cxx11::string_const,Typelib::Registry::RegistryType>>,std::less<std::__cxx11::string_const>,std::allocator<std::pair<std::__cxx11::string_const,Typelib::Registry::RegistryType>>>
      ::erase_abi_cxx11_((_Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,Typelib::Registry::RegistryType>,std::_Select1st<std::pair<std::__cxx11::string_const,Typelib::Registry::RegistryType>>,std::less<std::__cxx11::string_const>,std::allocator<std::pair<std::__cxx11::string_const,Typelib::Registry::RegistryType>>>
                          *)(__filename + 0x30),__position_00);
    }
  }
  return (int)this;
}

Assistant:

std::set<Type *> Registry::remove(Type const& type)
    {
        std::set<Type*> types = reverseDepends(type);

        TypeMap::iterator global_it = m_global.begin(), global_end = m_global.end();
        while (global_it != global_end)
        {
            if (types.count(global_it->second.type))
                m_global.erase(global_it++);
            else ++global_it;
        }

        NameMap::iterator current_it = m_current.begin(), current_end = m_current.end();
        while (current_it != current_end)
        {
            if (types.count(current_it->second.type))
                m_current.erase(current_it++);
            else ++current_it;
        }

        return types;
    }